

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationTOIDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
SimulationTOIDecPOMDPDiscrete::Step
          (SimulationTOIDecPOMDPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs,uint t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *oIs,double *r,double *sumR,
          double specialR)

{
  bool bVar1;
  TOIDecPOMDPDiscrete *pTVar2;
  ostream *poVar3;
  State *pSVar4;
  JointAction *pJVar5;
  JointObservation *pJVar6;
  TransitionObservationIndependentMADPDiscrete *this_00;
  void *this_01;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  Simulation *in_RDI;
  double *in_R9;
  double in_XMM0_Qa;
  double dVar7;
  double __x;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double *in_stack_00000008;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sIs_suc;
  undefined4 in_stack_fffffffffffffd98;
  Index in_stack_fffffffffffffd9c;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffda0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdd0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdd8;
  TransitionObservationIndependentMADPDiscrete *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe00;
  TransitionObservationIndependentMADPDiscrete *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe38;
  State *in_stack_fffffffffffffe40;
  string local_118 [32];
  string local_f8 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff20;
  TransitionObservationIndependentMADPDiscrete *in_stack_ffffffffffffff28;
  string local_b8 [32];
  string local_98 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff88;
  undefined1 extraout_var [56];
  
  PlanningUnitTOIDecPOMDPDiscrete::GetReferred
            (*(PlanningUnitTOIDecPOMDPDiscrete **)&in_RDI[3]._m_nrRuns);
  TransitionObservationIndependentMADPDiscrete::SampleSuccessorState
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  PlanningUnitTOIDecPOMDPDiscrete::GetReferred
            (*(PlanningUnitTOIDecPOMDPDiscrete **)&in_RDI[3]._m_nrRuns);
  TransitionObservationIndependentMADPDiscrete::SampleJointObservation
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdb0,
             in_stack_fffffffffffffda8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdb0);
  pTVar2 = PlanningUnitTOIDecPOMDPDiscrete::GetReferred
                     (*(PlanningUnitTOIDecPOMDPDiscrete **)&in_RDI[3]._m_nrRuns);
  dVar7 = (double)(**(code **)(*(long *)&(pTVar2->super_TransitionObservationIndependentMADPDiscrete
                                         ).super_MultiAgentDecisionProcess + 0x170))
                            (pTVar2,in_RCX,in_RSI);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_XMM0_Qa;
  *in_R9 = dVar7 + in_XMM0_Qa;
  dVar7 = *in_R9;
  __x = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8f75fe);
  auVar9 = vcvtusi2sd_avx512f(auVar9,in_EDX);
  auVar8._0_8_ = pow(__x,auVar9._0_8_);
  auVar8._8_56_ = extraout_var;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *in_stack_00000008;
  auVar9 = vfmadd213sd_fma(auVar8._0_16_,auVar10,auVar11);
  *in_stack_00000008 = auVar9._0_8_;
  bVar1 = Simulation::GetVerbose(in_RDI);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Simulation::RunSimulation ");
    poVar3 = std::operator<<(poVar3,"(");
    PlanningUnitTOIDecPOMDPDiscrete::GetReferred
              (*(PlanningUnitTOIDecPOMDPDiscrete **)&in_RDI[3]._m_nrRuns);
    pSVar4 = TransitionObservationIndependentMADPDiscrete::GetState
                       (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    (*(pSVar4->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[3])(local_98);
    poVar3 = std::operator<<(poVar3,local_98);
    poVar3 = std::operator<<(poVar3,",");
    (**(code **)(**(long **)&in_RDI[3]._m_nrRuns + 0x48))(*(long **)&in_RDI[3]._m_nrRuns,in_RSI);
    pJVar5 = PlanningUnitMADPDiscrete::GetJointAction
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    (*pJVar5->_vptr_JointAction[4])(local_b8);
    poVar3 = std::operator<<(poVar3,local_b8);
    poVar3 = std::operator<<(poVar3,",");
    PlanningUnitTOIDecPOMDPDiscrete::GetReferred
              (*(PlanningUnitTOIDecPOMDPDiscrete **)&in_RDI[3]._m_nrRuns);
    in_stack_fffffffffffffe40 =
         TransitionObservationIndependentMADPDiscrete::GetState
                   (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    (*(in_stack_fffffffffffffe40->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[3])
              (&stack0xffffffffffffff28);
    in_stack_fffffffffffffe38 = std::operator<<(poVar3,(string *)&stack0xffffffffffffff28);
    poVar3 = std::operator<<(in_stack_fffffffffffffe38,") (p ");
    PlanningUnitTOIDecPOMDPDiscrete::GetReferred
              (*(PlanningUnitTOIDecPOMDPDiscrete **)&in_RDI[3]._m_nrRuns);
    dVar7 = TransitionObservationIndependentMADPDiscrete::GetTransitionProbability
                      (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0
                       ,in_stack_fffffffffffffdc8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    poVar3 = std::operator<<(poVar3,") jo ");
    PrintTools::SoftPrintVector<unsigned_int>(in_stack_ffffffffffffff88);
    poVar3 = std::operator<<(poVar3,local_f8);
    poVar3 = std::operator<<(poVar3," ");
    PlanningUnitMADPDiscrete::IndividualToJointObservationIndices
              (in_stack_fffffffffffffda0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    pJVar6 = PlanningUnitMADPDiscrete::GetJointObservation
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    (*pJVar6->_vptr_JointObservation[4])(local_118);
    this_00 = (TransitionObservationIndependentMADPDiscrete *)std::operator<<(poVar3,local_118);
    poVar3 = std::operator<<((ostream *)this_00," (p ");
    pTVar2 = PlanningUnitTOIDecPOMDPDiscrete::GetReferred
                       (*(PlanningUnitTOIDecPOMDPDiscrete **)&in_RDI[3]._m_nrRuns);
    dVar7 = TransitionObservationIndependentMADPDiscrete::GetObservationProbability
                      (this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)poVar3,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pTVar2,
                       in_stack_fffffffffffffdc8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    poVar3 = std::operator<<(poVar3,") r ");
    in_stack_fffffffffffffdb0 = (ostream *)std::ostream::operator<<(poVar3,*in_R9);
    poVar3 = std::operator<<(in_stack_fffffffffffffdb0," sumR ");
    this_01 = (void *)std::ostream::operator<<(poVar3,*in_stack_00000008);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_98);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe40,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdb0);
  return;
}

Assistant:

void SimulationTOIDecPOMDPDiscrete::Step(const std::vector<Index> &aIs, 
                                         unsigned int t,
                                         std::vector<Index> &sIs, 
                                         std::vector<Index> &oIs,
                                         double &r,
                                         double &sumR,
                                         double specialR) const
{
    vector<Index> sIs_suc=_m_puTOI->GetReferred()->
        SampleSuccessorState(sIs,aIs);

    oIs=_m_puTOI->GetReferred()->SampleJointObservation(aIs,sIs_suc);
    r = _m_puTOI->GetReferred()->GetReward(sIs,aIs) + specialR;

    // calc. the discounted reward
    sumR+=r*pow(_m_puTOI->GetDiscount(),static_cast<double>(t));
    
    if(GetVerbose())
        cout << "Simulation::RunSimulation "
#if 0
             << "("
             << SoftPrintVector(sIs) << "," 
             << SoftPrintVector(aIs) << ","
             << SoftPrintVector(sIs_suc) << ") "
#endif
             << "("
             << (_m_puTOI->GetReferred()->GetState(sIs)->SoftPrintBrief())
             << ","
             << (_m_puTOI->GetJointAction(
                     _m_puTOI->IndividualToJointActionIndices(aIs)))
            ->SoftPrintBrief()
             << ","
             << (_m_puTOI->GetReferred()->GetState(sIs_suc)->SoftPrintBrief())
             << ") (p " 
             << _m_puTOI->GetReferred()->
            GetTransitionProbability(sIs,aIs,sIs_suc)
             << ") jo " << SoftPrintVector(oIs) << " "
             << (_m_puTOI->GetJointObservation(
                     _m_puTOI->IndividualToJointObservationIndices(oIs)))
            ->SoftPrintBrief()
             << " (p " 
             << _m_puTOI->GetReferred()->
            GetObservationProbability(aIs,sIs_suc,oIs)
             << ") r " << r << " sumR " << sumR << endl;

    sIs = sIs_suc;
}